

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

iter_type __thiscall
booster::locale::impl_posix::time_put_posix<wchar_t>::do_put
          (time_put_posix<wchar_t> *this,iter_type out,ios_base *param_2,wchar_t param_3,tm *tm,
          char format,char modifier)

{
  streambuf_type *psVar1;
  undefined8 unaff_RBP;
  ulong uVar2;
  locale_t lc;
  locale_t p_Var3;
  bool bVar4;
  iter_type iVar5;
  undefined3 in_stack_00000009;
  char_type_conflict fmt [4];
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> local_58;
  wstring local_48;
  undefined4 local_28;
  int local_24;
  int local_20;
  undefined4 local_1c;
  
  local_58._M_sbuf = out._M_sbuf;
  local_28 = 0x25;
  p_Var3 = (locale_t)0x0;
  bVar4 = modifier == '\0';
  if (bVar4) {
    modifier = format;
  }
  local_24 = (int)modifier;
  lc = (locale_t)(ulong)_format;
  if (bVar4) {
    lc = p_Var3;
  }
  local_20 = (int)(char)lc;
  local_1c = 0;
  local_58._M_failed = out._M_failed;
  ftime_traits<wchar_t>::ftime_abi_cxx11_
            (&local_48,(ftime_traits<wchar_t> *)&local_28,&tm->tm_sec,
             (tm *)*(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,lc);
  for (; psVar1 = local_58._M_sbuf, p_Var3 < local_48._M_string_length;
      p_Var3 = (locale_t)(ulong)((int)p_Var3 + 1)) {
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=
              (&local_58,local_48._M_dataplus._M_p[(long)p_Var3]);
  }
  uVar2 = CONCAT71((int7)((ulong)unaff_RBP >> 8),local_58._M_failed);
  std::__cxx11::wstring::~wstring((wstring *)&local_48);
  iVar5._8_8_ = uVar2 & 0xffffffff;
  iVar5._M_sbuf = psVar1;
  return iVar5;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,CharType /*fill*/,std::tm const *tm,char format,char modifier) const
    {
        char_type fmt[4] = { '%' , modifier != 0 ? modifier : format , modifier == 0 ? '\0' : format };
        string_type res = ftime_traits<char_type>::ftime(fmt,tm,*lc_);
        for(unsigned i=0;i<res.size();i++)
            *out++ = res[i];
        return out;
    }